

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O1

bool load_char_obj(DESCRIPTOR_DATA *d,char *name)

{
  byte *pbVar1;
  long *vector;
  long *vector_00;
  long *vector_01;
  char cVar2;
  bool bVar3;
  int iVar4;
  CHAR_DATA *nch;
  PC_DATA *pPVar5;
  char *pcVar6;
  long lVar7;
  char **ppcVar8;
  FILE *pFVar9;
  RACE_DATA *pRVar10;
  CClass *pCVar11;
  CProficiencies *pCVar12;
  basic_string_view<char> fmt;
  string_view fmt_00;
  string_view fmt_01;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string buffer;
  int returnCode;
  char strsave [4608];
  _func_int **local_14a8 [2];
  _func_int *local_1498 [2];
  char *local_1488 [3];
  buffer<char> local_1470;
  char local_1450 [504];
  char local_1258 [4648];
  
  nch = new_char();
  pPVar5 = new_pcdata();
  nch->pcdata = pPVar5;
  d->character = nch;
  nch->desc = d;
  pPVar5->entering_text = false;
  pcVar6 = palloc_string(name);
  nch->name = pcVar6;
  lVar7 = get_pc_id();
  nch->id = lVar7;
  iVar4 = race_lookup("human");
  nch->race = (short)iVar4;
  nch->level = 0;
  pbVar1 = (byte *)((long)nch->act + 2);
  *pbVar1 = *pbVar1 | 1;
  pbVar1 = (byte *)((long)nch->comm + 1);
  *pbVar1 = *pbVar1 | 0x60;
  zero_vector(nch->pcdata->trust);
  pcVar6 = palloc_string("<%hhp %mm %vmv %L> ");
  nch->prompt = pcVar6;
  lVar7 = 0xd6e;
  do {
    *(undefined1 *)((long)&nch->pcdata->next + lVar7) = 0;
    lVar7 = lVar7 + 0x1200;
  } while (lVar7 != 0x1756e);
  pPVar5 = nch->pcdata;
  pPVar5->read_next = 0;
  pPVar5->write_next = 0;
  pPVar5->pending = false;
  pCVar12 = &pPVar5->profs;
  if (pPVar5 == (PC_DATA *)0x0) {
    pCVar12 = &prof_none;
  }
  CProficiencies::SetChar(pCVar12,nch);
  pCVar12 = &nch->pcdata->profs;
  if (nch->pcdata == (PC_DATA *)0x0) {
    pCVar12 = &prof_none;
  }
  CProficiencies::SetPATime(pCVar12,0);
  pPVar5 = nch->pcdata;
  pPVar5->confirm_delete = false;
  pPVar5->pwd = (char *)0x0;
  pcVar6 = palloc_string("");
  nch->pcdata->bamfin = pcVar6;
  pcVar6 = palloc_string("");
  nch->pcdata->bamfout = pcVar6;
  pcVar6 = palloc_string("");
  pPVar5 = nch->pcdata;
  pPVar5->title = pcVar6;
  pPVar5->roll_time = current_time;
  pPVar5->birth_date = 0x5ec;
  pPVar5->death_time = 500;
  pPVar5->style = 0;
  zero_vector(pPVar5->styles);
  lVar7 = 0x134;
  do {
    *(undefined2 *)((long)&nch->next + lVar7 * 2) = 0xd;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x139);
  pPVar5 = nch->pcdata;
  memset(pPVar5->sect_time,0,0xa8);
  pPVar5->deposited_items[0] = 0;
  pPVar5->deposited_items[1] = 0;
  pPVar5->deposited_items[2] = 0;
  pPVar5->deposited_items[3] = 0;
  pPVar5->deposited_items[4] = 0;
  pPVar5->security = 0;
  pPVar5->bounty = 0;
  pPVar5->bounty_credits = 0;
  pPVar5->condition[1] = 0;
  pPVar5->condition[2] = 0;
  pPVar5->condition[3] = 0;
  pPVar5->condition[4] = 0;
  pPVar5->condition[5] = 0;
  nch->bounty_timer = 0;
  pPVar5->end_fun = (DO_FUN *)0x0;
  pPVar5->energy_state = 0;
  nch->dam_mod = 100.0;
  pPVar5->shifted = -1;
  nch->defense_mod = 0;
  pPVar5->tribe = 0;
  pPVar5->save_timer = 0;
  nch->disrupted = false;
  nch->stolen_from = false;
  pPVar5->souls = 0;
  nch->position = 0;
  pPVar5->cabal_level = 0;
  pPVar5->bounty_killed = 0;
  pPVar5->paladin_path = 0;
  pPVar5->editing_item = 0;
  lVar7 = 0x16;
  do {
    (&nch->pcdata->next)[lVar7] = (PC_DATA *)0x0;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x7a);
  ppcVar8 = &color_event[0].default_color;
  lVar7 = 0;
  do {
    nch->pcdata->color_scheme[lVar7] = *ppcVar8;
    lVar7 = lVar7 + 1;
    ppcVar8 = ppcVar8 + 3;
  } while (lVar7 != 0xd);
  pPVar5 = nch->pcdata;
  pPVar5->quests[0] = 0;
  pPVar5->quests[1] = 0;
  pPVar5->quests[2] = 0;
  pPVar5->quests[3] = 0;
  pPVar5->quests[4] = 0;
  pPVar5->quests[5] = 0;
  pPVar5->quests[6] = 0;
  pPVar5->quests[7] = 0;
  fclose((FILE *)fpReserve);
  pcVar6 = capitalize(name);
  sprintf(local_1258,"%s%s%s","../player",pcVar6,".gz");
  pFVar9 = fopen(local_1258,"r");
  if (pFVar9 != (FILE *)0x0) {
    fclose(pFVar9);
    local_1470.size_ = 0;
    local_1470._vptr_buffer = (_func_int **)&PTR_grow_00457340;
    local_1470.capacity_ = 500;
    fmt.size_ = 0xc;
    fmt.data_ = "gzip -dfq {}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_1488;
    args.desc_ = 0xc;
    local_1488[0] = local_1258;
    local_1470.ptr_ = local_1450;
    ::fmt::v9::detail::vformat_to<char>(&local_1470,fmt,args,(locale_ref)0x0);
    local_14a8[0] = local_1498;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_14a8,local_1470.ptr_,local_1470.ptr_ + local_1470.size_);
    if (local_1470.ptr_ != local_1450) {
      operator_delete(local_1470.ptr_,local_1470.capacity_);
    }
    iVar4 = system((char *)local_14a8[0]);
    local_1488[0] = (char *)CONCAT44(local_1488[0]._4_4_,iVar4);
    if (iVar4 != 0) {
      local_1470._vptr_buffer = local_14a8[0];
      fmt_00._M_str = "Command [{}] failed with exit code [{}]";
      fmt_00._M_len = 0x27;
      CLogger::Warn<char*,int&>
                ((CLogger *)&RS.field_0x140,fmt_00,(char **)&local_1470,(int *)local_1488);
    }
    if (local_14a8[0] != local_1498) {
      operator_delete(local_14a8[0],(ulong)(local_1498[0] + 1));
    }
  }
  pcVar6 = capitalize(name);
  sprintf(local_1258,"%s/%s.plr","../player",pcVar6);
  pFVar9 = fopen(local_1258,"r");
  if (pFVar9 != (FILE *)0x0) {
    memset(rgObjNest,0,800);
LAB_002bed73:
    while( true ) {
      while( true ) {
        cVar2 = fread_letter((FILE *)pFVar9);
        if (cVar2 == '#') break;
        if (cVar2 != '*') {
          pcVar6 = "Load_char_obj: # not found.";
          goto LAB_002bee4a;
        }
        fread_to_eol((FILE *)pFVar9);
      }
      pcVar6 = fread_word((FILE *)pFVar9);
      bVar3 = str_cmp(pcVar6,"PLAYER");
      if (bVar3) break;
      fread_char(nch,(FILE *)pFVar9);
    }
    bVar3 = str_cmp(pcVar6,"OBJECT");
    if (bVar3) {
      bVar3 = str_cmp(pcVar6,"O");
      if (bVar3) {
        bVar3 = str_cmp(pcVar6,"CHARMED");
        if (!bVar3) {
          fread_charmie(nch,(FILE *)pFVar9);
          goto LAB_002bed73;
        }
        bVar3 = str_cmp(pcVar6,"PET");
        if (!bVar3) {
          fread_pet(nch,(FILE *)pFVar9);
          goto LAB_002bed73;
        }
        bVar3 = str_cmp(pcVar6,"END");
        if (bVar3) {
          pcVar6 = "Load_char_obj: bad section.";
LAB_002bee4a:
          fmt_01._M_str = pcVar6;
          fmt_01._M_len = 0x1b;
          CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt_01);
        }
        fclose(pFVar9);
        goto LAB_002bee68;
      }
    }
    fread_obj(nch,(FILE *)pFVar9);
    goto LAB_002bed73;
  }
LAB_002bee68:
  free_pstring(nch->true_name);
  pcVar6 = palloc_string(name);
  nch->true_name = pcVar6;
  free_pstring(nch->backup_true_name);
  pcVar6 = palloc_string(name);
  nch->backup_true_name = pcVar6;
  fpReserve = (FILE *)fopen("/dev/null","r");
  vector = nch->imm_flags;
  zero_vector(vector);
  vector_00 = nch->res_flags;
  zero_vector(vector_00);
  vector_01 = nch->vuln_flags;
  zero_vector(vector_01);
  if (pFVar9 == (FILE *)0x0) {
    BITWISE_OR(vector,limmune_flags);
    BITWISE_OR(vector_00,lres_flags);
    BITWISE_OR(vector_01,lvuln_flags);
  }
  else {
    if (nch->race == 0) {
      iVar4 = race_lookup("human");
      nch->race = (short)iVar4;
    }
    nch->size = pc_race_table[nch->race].size;
    nch->dam_type = 0x11;
    lVar7 = 0;
    do {
      pcVar6 = *(char **)((long)nch->race * 0x88 + 0x49ff50 + lVar7 * 8);
      if (pcVar6 == (char *)0x0) break;
      group_add(nch,pcVar6,false);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 5);
    pRVar10 = race_data_lookup((int)nch->race);
    BITWISE_OR(nch->affected_by,pRVar10->aff);
    pRVar10 = race_data_lookup((int)nch->race);
    BITWISE_OR(vector,pRVar10->imm);
    pRVar10 = race_data_lookup((int)nch->race);
    BITWISE_OR(vector_00,pRVar10->res);
    pRVar10 = race_data_lookup((int)nch->race);
    BITWISE_OR(vector_01,pRVar10->vuln);
    pRVar10 = race_data_lookup((int)nch->race);
    copy_vector(nch->form,pRVar10->form);
    pRVar10 = race_data_lookup((int)nch->race);
    copy_vector(nch->parts,pRVar10->parts);
    BITWISE_OR(vector,limmune_flags);
    BITWISE_OR(vector_00,lres_flags);
    BITWISE_OR(vector_01,lvuln_flags);
    if (nch->version < 2) {
      pCVar11 = nch->my_class;
      if ((pCVar11 == (CClass *)0x0) &&
         ((nch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
          (pCVar11 = nch->pIndexData->my_class, pCVar11 == (CClass *)0x0)))) {
        pCVar11 = CClass::GetClass(0);
      }
      pcVar6 = RString::operator_cast_to_char_(&pCVar11->base_group);
      group_add(nch,pcVar6,false);
      pCVar11 = nch->my_class;
      if ((pCVar11 == (CClass *)0x0) &&
         ((nch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
          (pCVar11 = nch->pIndexData->my_class, pCVar11 == (CClass *)0x0)))) {
        pCVar11 = CClass::GetClass(0);
      }
      pcVar6 = RString::operator_cast_to_char_(&pCVar11->default_group);
      group_add(nch,pcVar6,true);
      nch->pcdata->learned[gsn_recall] = 0x32;
    }
  }
  return pFVar9 != (FILE *)0x0;
}

Assistant:

bool load_char_obj(DESCRIPTOR_DATA *d, char *name)
{
	char strsave[MAX_INPUT_LENGTH];
	CHAR_DATA *ch;
	FILE *fp;
	bool found;
	int stat;
	int pos;
	int i;

	CHAR_DATA *charg = new CHAR_DATA;

	ch = new_char();
	ch->pcdata = new_pcdata();

	d->character = ch;
	ch->desc = d;
	ch->pcdata->entering_text = false;
	ch->name = palloc_string(name);
	ch->id = get_pc_id();
	ch->race = race_lookup("human");
	ch->level = 0;

	SET_BIT(ch->act, PLR_NOSUMMON);
	SET_BIT(ch->comm, COMM_COMBINE);
	SET_BIT(ch->comm, COMM_PROMPT);

	zero_vector(ch->pcdata->trust);

	ch->prompt = palloc_string("<%hhp %mm %vmv %L> ");

	for (i = 0; i < 20; i++)
	{
		ch->pcdata->queue[i][0] = '\0';
	}

	ch->pcdata->read_next = 0;
	ch->pcdata->write_next = 0;
	ch->pcdata->pending = 0;
	ch->Profs()->SetChar(ch);
	ch->Profs()->SetPATime(0);
	ch->pcdata->confirm_delete = false;
	ch->pcdata->pwd = nullptr;
	ch->pcdata->bamfin = palloc_string("");
	ch->pcdata->bamfout = palloc_string("");
	ch->pcdata->title = palloc_string("");
	ch->pcdata->roll_time = current_time;
	ch->pcdata->birth_date = 1516; // rs starts in 1515
	ch->pcdata->death_time = 500;
	ch->pcdata->style = 0;

	zero_vector(ch->pcdata->styles);

	for (stat = 0; stat < MAX_STATS; stat++)
	{
		ch->perm_stat[stat] = 13;
	}

	for (stat = 0; stat < SECT_MAX; stat++)
	{
		ch->pcdata->sect_time[stat] = 0;
	}

	for (stat = 0; stat < MAX_STORED_ITEMS; stat++)
	{
		ch->pcdata->deposited_items[stat] = 0;
	}

	ch->pcdata->condition[COND_THIRST] = 0;
	ch->pcdata->condition[COND_FULL] = 0;
	ch->pcdata->condition[COND_HUNGER] = 0;
	ch->pcdata->condition[COND_STARVING] = 0;
	ch->pcdata->condition[COND_DEHYDRATED] = 0;
	ch->pcdata->security = 0; /* OLC */
	ch->pcdata->bounty = 0;
	ch->pcdata->bounty_credits = 0;
	ch->bounty_timer = 0;
	ch->pcdata->end_fun = nullptr;
	ch->pcdata->energy_state = 0;
	ch->dam_mod = 100;
	ch->pcdata->shifted = -1;
	ch->defense_mod = 0;
	ch->pcdata->tribe = 0;
	ch->pcdata->save_timer = 0;
	ch->disrupted = false;
	ch->stolen_from = false;
	ch->pcdata->souls = 0;
	ch->position = 0;
	ch->pcdata->cabal_level = 0;
	ch->pcdata->bounty_killed = 0;
	ch->pcdata->paladin_path = 0;
	ch->pcdata->editing_item = 0;

	for (pos = 0; pos < 100; pos++)
	{
		ch->pcdata->recentkills[pos] = nullptr;
	}

	for (pos = 0; pos < MAX_EVENTS; pos++)
	{
		ch->pcdata->color_scheme[pos] = color_event[pos].default_color;
	}

	for (pos = 0; pos < MAX_QUESTS; pos++)
	{
		ch->pcdata->quests[pos] = 0;
	}

	found = false;

	fclose(fpReserve);

	/* decompress if .gz file exists */
	sprintf(strsave, "%s%s%s", RIFT_PLAYER_DIR, capitalize(name), ".gz");

	if ((fp = fopen(strsave, "r")) != nullptr)
	{
		fclose(fp);

		auto buffer = fmt::format("gzip -dfq {}", strsave);

		auto returnCode = system(buffer.c_str());
		if(returnCode != 0) // gzip returns 0 on SUCCESS, 1 on ERROR. system returns -1 on ERROR
			RS.Logger.Warn("Command [{}] failed with exit code [{}]", buffer.data(), returnCode);
	}

	sprintf(strsave, "%s/%s.plr", RIFT_PLAYER_DIR, capitalize(name));

	if ((fp = fopen(strsave, "r")) != nullptr)
	{
		int iNest;

		for (iNest = 0; iNest < MAX_NEST; iNest++)
			rgObjNest[iNest] = nullptr;

		found = true;

		for (;;)
		{
			char letter;
			char *word;

			letter = fread_letter(fp);
			if (letter == '*')
			{
				fread_to_eol(fp);
				continue;
			}

			if (letter != '#')
			{
				RS.Logger.Warn("Load_char_obj: # not found.");
				break;
			}

			word = fread_word(fp);

			if (!str_cmp(word, "PLAYER"))
			{
				fread_char(ch, fp);
			}
			else if (!str_cmp(word, "OBJECT"))
			{
				fread_obj(ch, fp);
			}
			else if (!str_cmp(word, "O"))
			{
				fread_obj(ch, fp);
			}
			else if (!str_cmp(word, "CHARMED"))
			{
				fread_charmie(ch, fp);
			}
			else if (!str_cmp(word, "PET"))
			{
				fread_pet(ch, fp);
			}
			else if (!str_cmp(word, "END"))
			{
				break;
			}
			else
			{
				RS.Logger.Warn("Load_char_obj: bad section.");
				break;
			}
		}

		fclose(fp);
	}

	free_pstring(ch->true_name);
	ch->true_name = palloc_string(name);

	free_pstring(ch->backup_true_name);
	ch->backup_true_name = palloc_string(name);

	fpReserve = fopen(NULL_FILE, "r");

	/* Morg - Valgrind fix */
	zero_vector(ch->imm_flags);
	zero_vector(ch->res_flags);
	zero_vector(ch->vuln_flags);

	/* initialize race */
	if (found)
	{
		int i;

		if (ch->race == 0)
			ch->race = race_lookup("human");

		ch->size = pc_race_table[ch->race].size;
		ch->dam_type = 17; /*punch */

		for (i = 0; i < 5; i++)
		{
			if (pc_race_table[ch->race].skills[i] == nullptr)
				break;

			group_add(ch, pc_race_table[ch->race].skills[i], false);
		}

		BITWISE_OR(ch->affected_by, race_data_lookup(ch->race)->aff);
		BITWISE_OR(ch->imm_flags, race_data_lookup(ch->race)->imm);
		BITWISE_OR(ch->res_flags, race_data_lookup(ch->race)->res);
		BITWISE_OR(ch->vuln_flags, race_data_lookup(ch->race)->vuln);

		copy_vector(ch->form, race_data_lookup(ch->race)->form);
		copy_vector(ch->parts, race_data_lookup(ch->race)->parts);
	}

	BITWISE_OR(ch->imm_flags, limmune_flags);
	BITWISE_OR(ch->res_flags, lres_flags);
	BITWISE_OR(ch->vuln_flags, lvuln_flags);

	/* RT initialize skills */

	if (found && ch->version < 2) /* need to add the new skills */
	{
		group_add(ch, ch->Class()->base_group, false);
		group_add(ch, ch->Class()->default_group, true);
		ch->pcdata->learned[gsn_recall] = 50;
	}

	return found;
}